

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  pointer s;
  int iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_6a8 [32];
  RegularExpression handleLeak;
  RegularExpression leak;
  RegularExpression invalidHeapArgument;
  RegularExpression uninitializedRead;
  RegularExpression unaddressableAccess;
  RegularExpression drMemoryError;
  ostringstream ostr;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  cmsys::RegularExpression::RegularExpression(&drMemoryError,"^Error #[0-9]+");
  cmsys::RegularExpression::RegularExpression(&unaddressableAccess,"UNADDRESSABLE ACCESS");
  cmsys::RegularExpression::RegularExpression(&uninitializedRead,"UNINITIALIZED READ");
  cmsys::RegularExpression::RegularExpression(&invalidHeapArgument,"INVALID HEAP ARGUMENT");
  cmsys::RegularExpression::RegularExpression(&leak,"LEAK");
  cmsys::RegularExpression::RegularExpression(&handleLeak,"HANDLE LEAK");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  pbVar2 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = 0;
  s = lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (s == pbVar2) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)log,local_6a8);
      std::__cxx11::string::~string(local_6a8);
      this->DefectCount = this->DefectCount + iVar6;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      cmsys::RegularExpression::~RegularExpression(&handleLeak);
      cmsys::RegularExpression::~RegularExpression(&leak);
      cmsys::RegularExpression::~RegularExpression(&invalidHeapArgument);
      cmsys::RegularExpression::~RegularExpression(&uninitializedRead);
      cmsys::RegularExpression::~RegularExpression(&unaddressableAccess);
      cmsys::RegularExpression::~RegularExpression(&drMemoryError);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return iVar6 == 0;
    }
    poVar4 = std::operator<<((ostream *)&ostr,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar3 = cmsys::RegularExpression::find(&drMemoryError,s);
    if (bVar3) {
      bVar3 = cmsys::RegularExpression::find(&unaddressableAccess,s);
      iVar6 = iVar6 + 1;
      lVar5 = 0x54;
      if (!bVar3) {
        bVar3 = cmsys::RegularExpression::find(&uninitializedRead,s);
        if (!bVar3) {
          bVar3 = cmsys::RegularExpression::find(&leak,s);
          lVar5 = 0x38;
          if (!bVar3) {
            bVar3 = cmsys::RegularExpression::find(&handleLeak,s);
            lVar5 = 0x38;
            if (!bVar3) {
              bVar3 = cmsys::RegularExpression::find(&invalidHeapArgument,s);
              lVar5 = 0x1c;
              if (!bVar3) goto LAB_0018e53f;
            }
          }
        }
      }
      piVar1 = (int *)((long)(results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar5);
      *piVar1 = *piVar1 + 1;
    }
LAB_0018e53f:
    s = s + 1;
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);

  cmsys::RegularExpression drMemoryError("^Error #[0-9]+");

  cmsys::RegularExpression unaddressableAccess("UNADDRESSABLE ACCESS");
  cmsys::RegularExpression uninitializedRead("UNINITIALIZED READ");
  cmsys::RegularExpression invalidHeapArgument("INVALID HEAP ARGUMENT");
  cmsys::RegularExpression leak("LEAK");
  cmsys::RegularExpression handleLeak("HANDLE LEAK");

  int defects = 0;

  std::ostringstream ostr;
  for (const auto& l : lines) {
    ostr << l << std::endl;
    if (drMemoryError.find(l)) {
      defects++;
      if (unaddressableAccess.find(l) || uninitializedRead.find(l)) {
        results[cmCTestMemCheckHandler::UMR]++;
      } else if (leak.find(l) || handleLeak.find(l)) {
        results[cmCTestMemCheckHandler::MLK]++;
      } else if (invalidHeapArgument.find(l)) {
        results[cmCTestMemCheckHandler::FMM]++;
      }
    }
  }

  log = ostr.str();

  this->DefectCount += defects;
  return defects == 0;
}